

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O2

void __thiscall cppcms::filters::datetime::datetime(datetime *this,datetime *other)

{
  streamable::streamable(&this->time_,&other->time_);
  std::__cxx11::string::string((string *)&this->tz_,(string *)&other->tz_);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

datetime::datetime(datetime const &other) : time_(other.time_),tz_(other.tz_) {}